

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmultipart.cpp
# Opt level: O2

void convert(vector<const_char_*,_std::allocator<const_char_*>_> *in,
            vector<const_char_*,_std::allocator<const_char_*>_> views,char *outname,bool override)

{
  int iVar1;
  int iVar2;
  int iVar3;
  PixelType PVar4;
  pointer ppcVar5;
  char *pcVar6;
  sbyte sVar7;
  pointer pMVar8;
  pointer pFVar9;
  char cVar10;
  bool bVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  Header *pHVar15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
  *this;
  string *psVar16;
  _Rb_tree_node_base *p_Var17;
  _Rb_tree_node_base *p_Var18;
  int *piVar19;
  long lVar20;
  invalid_argument *piVar21;
  int iVar22;
  undefined7 in_register_00000011;
  Header *this_00;
  size_type __n;
  long lVar23;
  string *psVar24;
  long lVar25;
  PixelType *pPVar26;
  ulong uVar27;
  long lVar28;
  size_t i;
  bool pforce;
  MultiPartInputFile infile;
  vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>
  output_channels;
  MultiPartOutputFile outfile;
  long alStack_1a0 [2];
  long *local_190;
  long *local_188;
  undefined8 local_180;
  vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>
  input_channels;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  channelstore;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> output_headers;
  vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_> output_framebuffers;
  InputPart inpart;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  char *local_d0;
  string *local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  ulong local_a8;
  ulong local_a0;
  long local_98;
  long local_90;
  int pnum;
  string hero;
  FrameBuffer input_framebuffer;
  
  local_d0 = (char *)CONCAT71(in_register_00000011,override);
  ppcVar5 = (in->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((long)(in->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)ppcVar5 != 8) {
    piVar21 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar21,"can only convert one file at once - use \'combine\' mode for multiple files"
              );
    __cxa_throw(piVar21,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pcVar6 = *ppcVar5;
  iVar12 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartInputFile::MultiPartInputFile(&infile,pcVar6,iVar12,true);
  iVar12 = Imf_3_2::MultiPartInputFile::parts();
  if (iVar12 == 1) {
    input_channels.
    super__Vector_base<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    input_channels.
    super__Vector_base<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    input_channels.
    super__Vector_base<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    hero._M_dataplus._M_p = (pointer)&hero.field_2;
    hero._M_string_length = 0;
    hero.field_2._M_local_buf[0] = '\0';
    pHVar15 = (Header *)Imf_3_2::MultiPartInputFile::header((int)&infile);
    cVar10 = Imf_3_2::hasMultiView(pHVar15);
    if (cVar10 != '\0') {
      pHVar15 = (Header *)Imf_3_2::MultiPartInputFile::header((int)&infile);
      __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)Imf_3_2::multiView_abi_cxx11_(pHVar15);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&outfile,__x);
      if ((pointer)alStack_1a0[0] != _outfile) {
        std::__cxx11::string::_M_assign((string *)&hero);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&outfile);
    }
    Imf_3_2::
    GetChannelsInMultiPartFile<std::vector<Imf_3_2::MultiViewChannelName,std::allocator<Imf_3_2::MultiViewChannelName>>>
              (&infile,&input_channels);
    std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>::
    vector(&output_channels,&input_channels);
    _outfile = output_channels.
               super__Vector_base<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>
               ._M_impl.super__Vector_impl_data._M_start;
    input_framebuffer._map._M_t._M_impl._0_8_ =
         output_channels.
         super__Vector_base<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    uVar13 = Imf_3_2::
             SplitChannels<__gnu_cxx::__normal_iterator<Imf_3_2::MultiViewChannelName*,std::vector<Imf_3_2::MultiViewChannelName,std::allocator<Imf_3_2::MultiViewChannelName>>>>
                       ((__normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                         *)&outfile,
                        (__normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                         *)&input_framebuffer,true,&hero);
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::vector
              (&output_headers,(long)(int)uVar13,(allocator_type *)&outfile);
    std::vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>::vector
              (&output_framebuffers,(long)(int)uVar13,(allocator_type *)&outfile);
    input_framebuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &input_framebuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
    input_framebuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    input_framebuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    input_framebuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    if ((int)uVar13 < 1) {
      uVar13 = 0;
    }
    input_framebuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         input_framebuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (lVar25 = 0; (ulong)uVar13 * 0x38 - lVar25 != 0; lVar25 = lVar25 + 0x38) {
      this_00 = output_headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar25;
      pHVar15 = (Header *)Imf_3_2::MultiPartInputFile::header((int)&infile);
      Imf_3_2::Header::operator=(this_00,pHVar15);
      cVar10 = Imf_3_2::hasMultiView(this_00);
      if (cVar10 != '\0') {
        Imf_3_2::Header::erase((char *)this_00);
      }
      channelstore.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&channelstore.
                     super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      channelstore.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      channelstore.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      _inpart = (pointer)&local_e0;
      local_e0._M_local_buf[0] = '\0';
      parse_filename((string *)&channelstore,(string *)&inpart,&pforce,&pnum);
      cVar10 = Imf_3_2::Header::hasName();
      if ((cVar10 == '\0') || (pforce == true)) {
        Imf_3_2::Header::setName((string *)this_00);
      }
      _outfile = (pointer)0x0;
      alStack_1a0[0] = 0;
      alStack_1a0[1] = 0;
      local_190 = alStack_1a0;
      local_180 = 0;
      local_188 = local_190;
      this = (_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
              *)Imf_3_2::Header::channels();
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
      ::operator=(this,(_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
                        *)&outfile);
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
                   *)&outfile);
      std::__cxx11::string::~string((string *)&inpart);
      std::__cxx11::string::~string((string *)&channelstore);
    }
    make_unique_names(&output_headers);
    Imf_3_2::MultiPartInputFile::header((int)&infile);
    psVar16 = (string *)Imf_3_2::Header::channels();
    p_Var17 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
    __n = 0;
    while( true ) {
      p_Var18 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
      if (p_Var17 == p_Var18) break;
      p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
      __n = __n + 1;
    }
    Imf_3_2::MultiPartInputFile::header((int)&infile);
    piVar19 = (int *)Imf_3_2::Header::dataWindow();
    iVar12 = *piVar19;
    iVar1 = piVar19[1];
    iVar2 = piVar19[2];
    iVar3 = piVar19[3];
    std::
    vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ::vector(&channelstore,__n,(allocator_type *)&outfile);
    iVar14 = (iVar2 - iVar12) + 1;
    if (iVar3 < iVar1 || iVar2 < iVar12) {
      iVar14 = 1;
    }
    iVar22 = (iVar3 - iVar1) + 1;
    if (iVar3 < iVar1 || iVar2 < iVar12) {
      iVar22 = 1;
    }
    local_b8 = (long)iVar14;
    local_b0 = (long)(iVar22 * iVar14);
    local_c0 = (long)(iVar14 * iVar1 + iVar12);
    lVar25 = 0;
    lVar28 = 0;
    uVar27 = 0;
    local_c8 = psVar16;
    while (uVar27 < (ulong)(((long)input_channels.
                                   super__Vector_base<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)input_channels.
                                  super__Vector_base<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 0x68)) {
      lVar23 = (long)*(int *)((long)&(output_channels.
                                      super__Vector_base<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->part_number +
                             lVar28);
      lVar20 = Imf_3_2::ChannelList::find(local_c8);
      psVar24 = (string *)
                (output_headers.
                 super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar23 * 0x38);
      local_90 = lVar23;
      psVar16 = (string *)Imf_3_2::Header::channels();
      pPVar26 = (PixelType *)(lVar20 + 0x120);
      Imf_3_2::ChannelList::insert
                (psVar16,(Channel *)
                         ((long)&((output_channels.
                                   super__Vector_base<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus.
                                 _M_p + lVar28));
      bVar11 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&((output_channels.
                                         super__Vector_base<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->view).
                                       _M_dataplus._M_p + lVar28),"");
      if (bVar11) {
        Imf_3_2::Header::setView(psVar24);
      }
      PVar4 = *pPVar26;
      sVar7 = (PVar4 != HALF) + 1;
      local_a8 = uVar27;
      std::vector<char,_std::allocator<char>_>::resize
                ((vector<char,_std::allocator<char>_> *)
                 ((long)&((channelstore.
                           super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar25),local_b0 << sVar7);
      pFVar9 = output_framebuffers.
               super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pMVar8 = output_channels.
               super__Vector_base<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_a0 = (ulong)(PVar4 != HALF) * 2 + 2;
      lVar20 = local_c0 << sVar7;
      uVar27 = local_b8 << sVar7;
      local_98 = lVar25;
      Imf_3_2::Slice::Slice
                ((Slice *)&outfile,*pPVar26,
                 (char *)(*(long *)((long)&((channelstore.
                                             super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                           super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                           super__Vector_impl_data._M_start + lVar25) - lVar20),
                 local_a0,uVar27,1,1,0.0,false,false);
      Imf_3_2::FrameBuffer::insert
                ((string *)(pFVar9 + local_90),
                 (Slice *)((long)&(pMVar8->name)._M_dataplus._M_p + lVar28));
      lVar25 = local_98;
      pMVar8 = input_channels.
               super__Vector_base<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>
               ._M_impl.super__Vector_impl_data._M_start;
      Imf_3_2::Slice::Slice
                ((Slice *)&outfile,*pPVar26,
                 (char *)(*(long *)((long)&((channelstore.
                                             super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                           super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                           super__Vector_impl_data._M_start + local_98) - lVar20),
                 local_a0,uVar27,1,1,0.0,false,false);
      Imf_3_2::FrameBuffer::insert
                ((string *)&input_framebuffer,
                 (Slice *)((long)&(pMVar8->internal_name)._M_dataplus._M_p + lVar28));
      lVar28 = lVar28 + 0x68;
      lVar25 = lVar25 + 0x18;
      uVar27 = local_a8 + 1;
    }
    iVar12 = Imf_3_2::globalThreadCount();
    Imf_3_2::MultiPartOutputFile::MultiPartOutputFile
              (&outfile,local_d0,
               output_headers.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
               _M_impl.super__Vector_impl_data._M_start,
               (int)(((long)output_headers.
                            super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)output_headers.
                           super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                           _M_impl.super__Vector_impl_data._M_start) / 0x38),false,iVar12);
    Imf_3_2::InputPart::InputPart(&inpart,&infile,0);
    Imf_3_2::InputPart::setFrameBuffer((FrameBuffer *)&inpart);
    Imf_3_2::InputPart::readPixels((int)&inpart,iVar1);
    for (uVar27 = 0;
        uVar27 < (ulong)(((long)output_framebuffers.
                                super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)output_framebuffers.
                               super__Vector_base<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x30);
        uVar27 = uVar27 + 1) {
      Imf_3_2::OutputPart::OutputPart((OutputPart *)&pnum,&outfile,(int)uVar27);
      Imf_3_2::OutputPart::setFrameBuffer((FrameBuffer *)&pnum);
      Imf_3_2::OutputPart::writePixels((int)(OutputPart *)&pnum);
    }
    Imf_3_2::MultiPartOutputFile::~MultiPartOutputFile(&outfile);
    std::
    vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ::~vector(&channelstore);
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&input_framebuffer);
    std::vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>::~vector
              (&output_framebuffers);
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::~vector(&output_headers);
    std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>::
    ~vector(&output_channels);
    std::__cxx11::string::~string((string *)&hero);
    std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>::
    ~vector(&input_channels);
    Imf_3_2::MultiPartInputFile::~MultiPartInputFile(&infile);
    return;
  }
  piVar21 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (piVar21,
             "can only convert single part EXRs to multipart EXR-2.0 files: use \'split\' mode instead"
            );
  __cxa_throw(piVar21,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
convert (
    vector<const char*> in,
    vector<const char*> views,
    const char*         outname,
    bool                override)
{
    if (in.size () != 1)
        throw invalid_argument("can only convert one file at once - use 'combine' mode for multiple files");

    MultiPartInputFile infile (in[0]);
    
    if (infile.parts () != 1)
        throw invalid_argument("can only convert single part EXRs to multipart EXR-2.0 files: use 'split' mode instead");


    vector<MultiViewChannelName> input_channels;

    string hero;
    if (hasMultiView (infile.header (0)))
    {
        StringVector h = multiView (infile.header (0));
        if (h.size () > 0) { hero = h[0]; }
    }

    // retrieve channel names from input file in view-friendly format
    GetChannelsInMultiPartFile (infile, input_channels);

    vector<MultiViewChannelName> output_channels = input_channels;
    // remap channels to multiple output parts
    int parts = SplitChannels (
                               output_channels.begin (), output_channels.end (), true, hero);

    vector<Header>      output_headers (parts);
    vector<FrameBuffer> output_framebuffers (parts);
    FrameBuffer         input_framebuffer;

    //
    // make all output headers the same as the input header but
    // with no channels
    //
    for (int i = 0; i < parts; i++)
    {
        Header& h = output_headers[i];
        h         = infile.header (0);
        if (hasMultiView (h)) h.erase ("multiView");

        string fn, pname;
        int    pnum;
        bool   pforce;
        parse_filename (fn, pname, pforce, pnum);
        if (!h.hasName () || pforce) h.setName (pname);

        h.channels () = ChannelList ();
    }

    make_unique_names (output_headers);

    const ChannelList& in_chanlist = infile.header (0).channels ();

    int channel_count = 0;
    for (ChannelList::ConstIterator i = in_chanlist.begin ();
         i != in_chanlist.end ();
         ++i)
    {
        ++channel_count;
    }

    Box2i dataWindow = infile.header (0).dataWindow ();
    int   pixel_count =
        (dataWindow.size ().y + 1) * (dataWindow.size ().x + 1);
    int pixel_width = dataWindow.size ().x + 1;

    // offset in pixels between base of array and 0,0
    int pixel_base = dataWindow.min.y * pixel_width + dataWindow.min.x;

    vector<vector<char>> channelstore (channel_count);

    //
    // insert channels into correct header and framebuffers
    //
    for (size_t i = 0; i < input_channels.size (); i++)
    {
        // read the part we should be writing channel into, insert into header
        int                        part = output_channels[i].part_number;
        ChannelList::ConstIterator chan =
            in_chanlist.find (input_channels[i].internal_name);
        Header& h = output_headers[part];
        h.channels ().insert (output_channels[i].name, chan.channel ());

        if (output_channels[i].view != "")
        {
            h.setView (output_channels[i].view);
        }

        // compute size of channel
        size_t samplesize = sizeof (float);
        if (chan.channel ().type == HALF) { samplesize = sizeof (half); }
        channelstore[i].resize (samplesize * pixel_count);

        output_framebuffers[part].insert (output_channels[i].name,
                                          Slice (chan.channel ().type,
                                                 &channelstore[i][0] - pixel_base * samplesize,
                                                 samplesize,
                                                 pixel_width * samplesize));

        input_framebuffer.insert (input_channels[i].internal_name,
                                  Slice (chan.channel ().type,
                                         &channelstore[i][0] - pixel_base * samplesize,
                                         samplesize,
                                         pixel_width * samplesize));
    }

    //
    // create output file
    //
    MultiPartOutputFile outfile (outname, &output_headers[0], output_headers.size ());
                                 
    InputPart inpart (infile, 0);

    //
    // read file
    //
    inpart.setFrameBuffer (input_framebuffer);
    inpart.readPixels (dataWindow.min.y, dataWindow.max.y);

    //
    // write each part
    //

    for (size_t i = 0; i < output_framebuffers.size (); i++)
    {
        OutputPart outpart (outfile, i);
        outpart.setFrameBuffer (output_framebuffers[i]);
        outpart.writePixels (dataWindow.max.y + 1 - dataWindow.min.y);
    }
}